

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O1

void __thiscall deci_FlexLexer::~deci_FlexLexer(deci_FlexLexer *this)

{
  long lVar1;
  undefined8 uVar2;
  yy_buffer_state *pyVar3;
  
  (this->super_FlexLexer)._vptr_FlexLexer = (_func_int **)&PTR__deci_FlexLexer_0011ecd8;
  if (this->yy_state_buf != (yy_state_type *)0x0) {
    operator_delete__(this->yy_state_buf);
  }
  free(this->yy_start_stack);
  if (this->yy_buffer_stack == (yy_buffer_state **)0x0) {
    pyVar3 = (yy_buffer_state *)0x0;
  }
  else {
    pyVar3 = this->yy_buffer_stack[this->yy_buffer_stack_top];
  }
  (*(this->super_FlexLexer)._vptr_FlexLexer[5])(this,pyVar3);
  free(this->yy_buffer_stack);
  std::ios_base::~ios_base((ios_base *)&this->field_0x150);
  uVar2 = __ITM_deregisterTMCloneTable;
  lVar1 = _VTT;
  *(long *)&this->yyin = _VTT;
  *(undefined8 *)(&this->yyin + *(long *)(lVar1 + -0x18)) = uVar2;
  *(undefined8 *)&this->field_0x38 = 0;
  std::ios_base::~ios_base((ios_base *)&this->field_0x40);
  return;
}

Assistant:

yyFlexLexer::~yyFlexLexer()
{
	delete [] yy_state_buf;
	yyfree( yy_start_stack  );
	yy_delete_buffer( YY_CURRENT_BUFFER );
	yyfree( yy_buffer_stack  );
}